

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex0_task.c
# Opt level: O0

int main(int argc,char **argv)

{
  s_awaiter_t *__awaiter_dummy__;
  char **argv_local;
  int argc_local;
  
  s_task_init_system_();
  s_task_create(g_stack_main,0x80000,main_task,(void *)(long)argc);
  s_task_join((s_awaiter_t *)0x0,g_stack_main);
  printf("all task is over\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    (void)argv;

    s_task_init_system();
    s_task_create(g_stack_main, sizeof(g_stack_main), main_task, (void*)(size_t)argc);
    s_task_join(__await__, g_stack_main);

    printf("all task is over\n");
    return 0;
}